

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O3

void __thiscall QtFontStyle::Key::Key(Key *this,QString *styleString)

{
  char cVar1;
  CutResult CVar2;
  int iVar3;
  long lVar4;
  qsizetype qVar5;
  short sVar6;
  ushort uVar7;
  char *pcVar8;
  qsizetype qVar9;
  QArrayData *pQVar10;
  storage_type_conflict *psVar11;
  long in_FS_OFFSET;
  QLatin1String QVar12;
  QLatin1String QVar13;
  QLatin1String QVar14;
  QStringView QVar15;
  QLatin1String QVar16;
  QLatin1String QVar17;
  QLatin1String QVar18;
  QLatin1String QVar19;
  QLatin1String QVar20;
  QLatin1String QVar21;
  QLatin1String QVar22;
  QLatin1String QVar23;
  QStringView QVar24;
  QStringView QVar25;
  QStringView QVar26;
  QLatin1String QVar27;
  QStringView QVar28;
  QStringView QVar29;
  QStringView QVar30;
  QArrayData *local_f0 [3];
  QArrayData *local_d8;
  undefined1 *puStack_d0;
  undefined1 *local_c8;
  QArrayData *local_b8;
  undefined1 *puStack_b0;
  undefined1 *local_a8;
  QArrayData *local_98;
  storage_type_conflict *psStack_90;
  undefined1 *local_88;
  QArrayData *local_78;
  storage_type_conflict *psStack_70;
  undefined1 *local_68;
  QArrayData *local_58;
  storage_type_conflict *psStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->field_0x2 = 0;
  *(undefined2 *)this = 0x640;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  psStack_50 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
  QString::toLower_helper((QString *)&local_58);
  psVar11 = psStack_50;
  if (local_48 + -4 < (undefined1 *)0x6) {
    (*(code *)(&DAT_006a6e00 + *(int *)(&DAT_006a6e00 + (long)(local_48 + -4) * 4)))();
    return;
  }
  local_78 = (QArrayData *)0x2;
  local_98 = (QArrayData *)0xffffffffffffffff;
  CVar2 = QtPrivate::QContainerImplHelper::mid
                    ((qsizetype)local_48,(qsizetype *)&local_78,(qsizetype *)&local_98);
  if (CVar2 == Null) {
    pQVar10 = (QArrayData *)0x0;
    psVar11 = (storage_type_conflict *)0x0;
  }
  else {
    psVar11 = psVar11 + (long)local_78;
    pQVar10 = local_98;
  }
  QVar12.m_data = (char *)0x2;
  QVar12.m_size = (qsizetype)&local_58;
  cVar1 = QString::startsWith(QVar12,0x6b2f86);
  if ((cVar1 == '\0') &&
     (QVar13.m_data = (char *)0x2, QVar13.m_size = (qsizetype)&local_58,
     cVar1 = QString::startsWith(QVar13,0x6abeca), cVar1 == '\0')) {
LAB_00491e17:
    QVar17.m_data = (char *)0x4;
    QVar17.m_size = (qsizetype)&local_58;
    lVar4 = QString::indexOf(QVar17,0x6a7ec6,CaseInsensitive);
    if (lVar4 == -1) {
      QVar19.m_data = (char *)0x4;
      QVar19.m_size = (qsizetype)&local_58;
      lVar4 = QString::indexOf(QVar19,0x6a7ea2,CaseInsensitive);
      sVar6 = 100;
      if (lVar4 == -1) {
        QVar20.m_data = &DAT_00000005;
        QVar20.m_size = (qsizetype)&local_58;
        lVar4 = QString::indexOf(QVar20,0x6a7eb4,CaseInsensitive);
        sVar6 = 300;
        if (lVar4 == -1) {
          QVar21.m_data = &DAT_00000005;
          QVar21.m_size = (qsizetype)&local_58;
          lVar4 = QString::indexOf(QVar21,0x6a7e9c,CaseInsensitive);
          sVar6 = 900;
          if (lVar4 == -1) {
            QCoreApplication::translate((char *)&local_78,"QFontDatabase","Normal",0x6a7ed0);
            iVar3 = QString::compare((QString *)&local_58,(CaseSensitivity)&local_78);
            if (local_78 != (QArrayData *)0x0) {
              LOCK();
              (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_78,2,0x10);
              }
            }
            if (iVar3 == 0) {
              sVar6 = 400;
            }
            else {
              local_68 = &DAT_aaaaaaaaaaaaaaaa;
              local_78 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
              psStack_70 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
              QCoreApplication::translate((char *)&local_98,"QFontDatabase","Bold",0);
              QString::toLower_helper((QString *)&local_78);
              if (local_98 != (QArrayData *)0x0) {
                LOCK();
                (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_98,2,0x10);
                }
              }
              if (local_48 == local_68) {
                QVar24.m_data = psStack_50;
                QVar24.m_size = (qsizetype)local_48;
                QVar29.m_data = psStack_70;
                QVar29.m_size = (qsizetype)local_48;
                cVar1 = QtPrivate::equalStrings(QVar24,QVar29);
                sVar6 = 700;
                if (cVar1 == '\0') goto LAB_004921ba;
              }
              else {
LAB_004921ba:
                QCoreApplication::translate((char *)&local_98,"QFontDatabase","Demi Bold",0);
                iVar3 = QString::compare((QString *)&local_58,(CaseSensitivity)&local_98);
                if (local_98 != (QArrayData *)0x0) {
                  LOCK();
                  (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
                       (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(local_98,2,0x10);
                  }
                }
                if (iVar3 == 0) {
                  sVar6 = 600;
                }
                else {
                  QCoreApplication::translate((char *)&local_98,"QFontDatabase","Medium",0x6a7f03);
                  iVar3 = QString::compare((QString *)&local_58,(CaseSensitivity)&local_98);
                  if (local_98 != (QArrayData *)0x0) {
                    LOCK();
                    (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
                         (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(local_98,2,0x10);
                    }
                  }
                  if (iVar3 == 0) {
                    sVar6 = 500;
                  }
                  else {
                    QCoreApplication::translate((char *)&local_98,"QFontDatabase","Black",0);
                    iVar3 = QString::compare((QString *)&local_58,(CaseSensitivity)&local_98);
                    if (local_98 != (QArrayData *)0x0) {
                      LOCK();
                      (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
                           (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                        QArrayData::deallocate(local_98,2,0x10);
                      }
                    }
                    if (iVar3 == 0) {
                      sVar6 = 900;
                    }
                    else {
                      local_88 = &DAT_aaaaaaaaaaaaaaaa;
                      local_98 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
                      psStack_90 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
                      QCoreApplication::translate((char *)&local_b8,"QFontDatabase","Light",0);
                      QString::toLower_helper((QString *)&local_98);
                      if (local_b8 != (QArrayData *)0x0) {
                        LOCK();
                        (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
                             (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                          QArrayData::deallocate(local_b8,2,0x10);
                        }
                      }
                      if (local_48 == local_88) {
                        QVar25.m_data = psStack_50;
                        QVar25.m_size = (qsizetype)local_48;
                        QVar30.m_data = psStack_90;
                        QVar30.m_size = (qsizetype)local_48;
                        cVar1 = QtPrivate::equalStrings(QVar25,QVar30);
                        sVar6 = 300;
                        if (cVar1 == '\0') goto LAB_00492374;
                      }
                      else {
LAB_00492374:
                        QCoreApplication::translate((char *)&local_b8,"QFontDatabase","Thin",0);
                        iVar3 = QString::compare((QString *)&local_58,(CaseSensitivity)&local_b8);
                        if (local_b8 != (QArrayData *)0x0) {
                          LOCK();
                          (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
                               (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                          UNLOCK();
                          if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                            QArrayData::deallocate(local_b8,2,0x10);
                          }
                        }
                        if (iVar3 == 0) {
                          sVar6 = 100;
                        }
                        else {
                          QCoreApplication::translate
                                    ((char *)&local_b8,"QFontDatabase","Extra Light",0);
                          iVar3 = QString::compare((QString *)&local_58,(CaseSensitivity)&local_b8);
                          if (local_b8 != (QArrayData *)0x0) {
                            LOCK();
                            (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
                                 (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                            UNLOCK();
                            if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                              QArrayData::deallocate(local_b8,2,0x10);
                            }
                          }
                          if (iVar3 == 0) {
                            sVar6 = 200;
                          }
                          else {
                            QCoreApplication::translate
                                      ((char *)&local_b8,"QFontDatabase","Extra Bold",0);
                            iVar3 = QString::compare((QString *)&local_58,(CaseSensitivity)&local_b8
                                                    );
                            if (local_b8 != (QArrayData *)0x0) {
                              LOCK();
                              (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
                                   (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                              UNLOCK();
                              if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                                QArrayData::deallocate(local_b8,2,0x10);
                              }
                            }
                            if (iVar3 == 0) {
                              sVar6 = 800;
                            }
                            else {
                              local_a8 = &DAT_aaaaaaaaaaaaaaaa;
                              local_b8 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
                              puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
                              QCoreApplication::translate
                                        ((char *)&local_d8,"QFontDatabase","Extra",0);
                              QString::toLower_helper((QString *)&local_b8);
                              if (local_d8 != (QArrayData *)0x0) {
                                LOCK();
                                (local_d8->ref_)._q_value.super___atomic_base<int>._M_i =
                                     (local_d8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                                UNLOCK();
                                if ((local_d8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                                  QArrayData::deallocate(local_d8,2,0x10);
                                }
                              }
                              lVar4 = QString::indexOf((QString *)&local_58,(longlong)&local_78,
                                                       CaseInsensitive);
                              if (lVar4 == -1) {
                                lVar4 = QString::indexOf((QString *)&local_58,(longlong)&local_98,
                                                         CaseInsensitive);
                                if (lVar4 == -1) {
                                  sVar6 = 400;
                                }
                                else {
                                  lVar4 = QString::indexOf((QString *)&local_58,(longlong)&local_b8,
                                                           CaseInsensitive);
                                  sVar6 = 200;
                                  if (lVar4 == -1) {
                                    sVar6 = 300;
                                  }
                                }
                              }
                              else {
                                local_c8 = &DAT_aaaaaaaaaaaaaaaa;
                                local_d8 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
                                puStack_d0 = &DAT_aaaaaaaaaaaaaaaa;
                                QCoreApplication::translate
                                          ((char *)local_f0,"QFontDatabase","Demi",0);
                                QString::toLower_helper((QString *)&local_d8);
                                if (local_f0[0] != (QArrayData *)0x0) {
                                  LOCK();
                                  (local_f0[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                                       (local_f0[0]->ref_)._q_value.super___atomic_base<int>._M_i +
                                       -1;
                                  UNLOCK();
                                  if ((local_f0[0]->ref_)._q_value.super___atomic_base<int>._M_i ==
                                      0) {
                                    QArrayData::deallocate(local_f0[0],2,0x10);
                                  }
                                }
                                lVar4 = QString::indexOf((QString *)&local_58,(longlong)&local_d8,
                                                         CaseInsensitive);
                                sVar6 = 600;
                                if (lVar4 == -1) {
                                  lVar4 = QString::indexOf((QString *)&local_58,(longlong)&local_b8,
                                                           CaseInsensitive);
                                  sVar6 = 800;
                                  if (lVar4 == -1) {
                                    sVar6 = 700;
                                  }
                                }
                                if (local_d8 != (QArrayData *)0x0) {
                                  LOCK();
                                  (local_d8->ref_)._q_value.super___atomic_base<int>._M_i =
                                       (local_d8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                                  UNLOCK();
                                  if ((local_d8->ref_)._q_value.super___atomic_base<int>._M_i == 0)
                                  {
                                    QArrayData::deallocate(local_d8,2,0x10);
                                  }
                                }
                              }
                              if (local_b8 != (QArrayData *)0x0) {
                                LOCK();
                                (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
                                     (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                                UNLOCK();
                                if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                                  QArrayData::deallocate(local_b8,2,0x10);
                                }
                              }
                            }
                          }
                        }
                      }
                      if (local_98 != (QArrayData *)0x0) {
                        LOCK();
                        (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
                             (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                          QArrayData::deallocate(local_98,2,0x10);
                        }
                      }
                    }
                  }
                }
              }
              if (local_78 != (QArrayData *)0x0) {
                LOCK();
                (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_78,2,0x10);
                }
              }
            }
          }
        }
      }
    }
    else {
      QVar18.m_data = (char *)0x4;
      QVar18.m_size = (qsizetype)&local_58;
      lVar4 = QString::indexOf(QVar18,0x6a7ecb,CaseInsensitive);
      sVar6 = 600;
      if (lVar4 == -1) {
        sVar6 = 700;
      }
    }
  }
  else if (pQVar10 == (QArrayData *)&DAT_00000008) {
    QVar14.m_data = "tralight";
    QVar14.m_size = 8;
    QVar26.m_data = psVar11;
    QVar26.m_size = 8;
    cVar1 = QtPrivate::equalStrings(QVar14,QVar26);
    sVar6 = 200;
    if (cVar1 == '\0') goto LAB_00491d9c;
  }
  else {
LAB_00491d9c:
    if (local_48 == (undefined1 *)0x9) {
      QVar15.m_data = psStack_50;
      QVar15.m_size = 9;
      QVar27.m_data = "tra light";
      QVar27.m_size = 9;
      cVar1 = QtPrivate::equalStrings(QVar15,QVar27);
      sVar6 = 200;
      if (cVar1 != '\0') goto LAB_00491efd;
    }
    if (pQVar10 == (QArrayData *)0x7) {
      pcVar8 = "trabold";
      qVar9 = 7;
      qVar5 = 7;
    }
    else {
      if (pQVar10 != (QArrayData *)&DAT_00000008) goto LAB_00491e17;
      pcVar8 = "tra bold";
      qVar9 = 8;
      qVar5 = 8;
    }
    QVar16.m_data = pcVar8;
    QVar16.m_size = qVar9;
    QVar28.m_data = psVar11;
    QVar28.m_size = qVar5;
    cVar1 = QtPrivate::equalStrings(QVar16,QVar28);
    sVar6 = 800;
    if (cVar1 == '\0') goto LAB_00491e17;
  }
LAB_00491efd:
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,2,0x10);
    }
  }
  *(ushort *)this = ((ushort)*(undefined3 *)this & 0xf003) + sVar6 * 4;
  if ((styleString->d).size != 0) {
    uVar7 = 1;
    QVar22.m_data = &DAT_00000006;
    QVar22.m_size = (qsizetype)styleString;
    lVar4 = QString::indexOf(QVar22,0x6a764b,CaseInsensitive);
    if (lVar4 == -1) {
      QVar23.m_data = (char *)0x7;
      QVar23.m_size = (qsizetype)styleString;
      lVar4 = QString::indexOf(QVar23,0x6a7652,CaseInsensitive);
      uVar7 = 2;
      if (lVar4 == -1) {
        QCoreApplication::translate((char *)&local_58,"QFontDatabase","Italic",0);
        uVar7 = 1;
        lVar4 = QString::indexOf((QString *)styleString,(longlong)&local_58,CaseInsensitive);
        if (local_58 != (QArrayData *)0x0) {
          LOCK();
          (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_58,2,0x10);
          }
        }
        if (lVar4 == -1) {
          QCoreApplication::translate((char *)&local_58,"QFontDatabase","Oblique",0);
          lVar4 = QString::indexOf((QString *)styleString,(longlong)&local_58,CaseInsensitive);
          if (local_58 != (QArrayData *)0x0) {
            LOCK();
            (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_58,2,0x10);
            }
          }
          uVar7 = 2;
          if (lVar4 == -1) goto LAB_00492088;
        }
      }
    }
    *(ushort *)this = *(ushort *)this & 0xfffc | uVar7;
  }
LAB_00492088:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QtFontStyle::Key::Key(const QString &styleString)
    : style(QFont::StyleNormal), weight(QFont::Normal), stretch(0)
{
    weight = getFontWeight(styleString);

    if (!styleString.isEmpty()) {
        // First the straightforward no-translation checks, these are fast.
        if (styleString.contains("Italic"_L1))
            style = QFont::StyleItalic;
        else if (styleString.contains("Oblique"_L1))
            style = QFont::StyleOblique;

        // Then the translation checks. These aren't as fast.
        else if (styleString.contains(QCoreApplication::translate("QFontDatabase", "Italic")))
            style = QFont::StyleItalic;
        else if (styleString.contains(QCoreApplication::translate("QFontDatabase", "Oblique")))
            style = QFont::StyleOblique;
    }
}